

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O0

void nn_sinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  nn_fsm *in_RDI;
  nn_sinproc *unaff_retaddr;
  nn_sinproc *sinproc;
  nn_fsm *pnVar2;
  int type_00;
  nn_fsm *self_00;
  
  pnVar2 = in_RDI;
  if (in_RDI == (nn_fsm *)0x0) {
    pnVar2 = (nn_fsm *)0x0;
  }
  if (pnVar2->state != 3) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sinproc->fsm.state == 3",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
            ,0x118);
    fflush(_stderr);
    nn_err_abort();
  }
  self_00 = pnVar2;
  nn_sinproc_shutdown_events
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(void *)CONCAT44(in_ESI,in_EDX))
  ;
  type_00 = (int)((ulong)pnVar2 >> 0x20);
  if (((*(int *)&self_00[1].fn == 7) &&
      (iVar1 = nn_fsm_event_active((nn_fsm_event *)0x1e72b2), iVar1 == 0)) &&
     (iVar1 = nn_fsm_event_active((nn_fsm_event *)0x1e72c8), iVar1 == 0)) {
    iVar1 = nn_fsm_event_active((nn_fsm_event *)0x1e72e5);
    if (iVar1 != 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "!nn_fsm_event_active (&sinproc->event_connect)",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
              ,300);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar1 = nn_fsm_event_active((nn_fsm_event *)0x1e7356);
    if (iVar1 != 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!nn_fsm_event_active (&sinproc->event_sent)"
              ,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
              ,0x12d);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_fsm_stopped(self_00,type_00);
  }
  return;
}

Assistant:

static void nn_sinproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);
    nn_assert (sinproc->fsm.state == 3);

    nn_sinproc_shutdown_events (sinproc, src, type, srcptr);

    /*  ***************  */
    /*  States to check  */
    /*  ***************  */

    /*  Have we got notification that peer is stopped  */
    if (nn_slow (sinproc->state != NN_SINPROC_STATE_STOPPING)) {
        return;
    }

    /*  Are all events processed? We can't cancel them unfortunately  */
    if (nn_fsm_event_active (&sinproc->event_received)
        || nn_fsm_event_active (&sinproc->event_disconnect))
    {
        return;
    }
    /*  These events are deemed to be impossible here  */
    nn_assert (!nn_fsm_event_active (&sinproc->event_connect));
    nn_assert (!nn_fsm_event_active (&sinproc->event_sent));

    /*  **********************************************  */
    /*  All checks are successful. Just stop right now  */
    /*  **********************************************  */

    nn_fsm_stopped (&sinproc->fsm, NN_SINPROC_STOPPED);
    return;
}